

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O1

ParsedSection __thiscall
QDateTimeParser::findTimeZone
          (QDateTimeParser *this,QStringView str,QDateTime *when,int maxVal,int minVal,int mode)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  QLatin1StringView needle;
  ParsedSection PVar6;
  
  uVar5 = 0x200000000;
  if ((str.m_size == 1 && mode == 1) && (*str.m_data == L'Z')) {
LAB_00418650:
    uVar3 = 0x100000000;
LAB_0041871f:
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    if (mode == 4) {
      uVar3 = 0;
      PVar6 = (ParsedSection)ZEXT816(0xffffffff);
    }
    else {
      PVar6 = findUtcOffset(this,str,mode);
      uVar3 = PVar6._0_8_ >> 0x20;
    }
    if ((mode - 4U < 0xfffffffe) && ((int)uVar3 < 1)) {
      PVar6 = findTimeZoneName(this,str,when);
      uVar3 = PVar6._0_8_ >> 0x20;
    }
    uVar4 = PVar6._8_8_;
    if (((uVar4 & 0xffffffff00000000) == 0x200000000) &&
       (PVar6.value < minVal || maxVal < PVar6.value)) {
      uVar4 = (ulong)(uint)PVar6.zeroes | 0x100000000;
    }
    if (0 < (int)uVar3) {
      uVar5 = uVar4 & 0xffffffff00000000;
      uVar3 = uVar3 << 0x20;
      uVar2 = PVar6._0_8_ & 0xffffffff;
      uVar4 = uVar4 & 0xffffffff;
      goto LAB_00418748;
    }
    if (mode == 1) {
      needle.m_data = "UTC";
      needle.m_size = 3;
      bVar1 = QtPrivate::startsWith(str,needle,CaseSensitive);
      if (bVar1) {
        uVar3 = 0x300000000;
        goto LAB_0041871f;
      }
      if ((str.m_size != 0) && (*str.m_data == L'Z')) goto LAB_00418650;
    }
    uVar2 = 0xffffffff;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
  }
LAB_00418748:
  PVar6._8_8_ = uVar4 | uVar5;
  PVar6._0_8_ = uVar2 | uVar3;
  return PVar6;
}

Assistant:

QDateTimeParser::ParsedSection
QDateTimeParser::findTimeZone(QStringView str, const QDateTime &when,
                              int maxVal, int minVal, int mode) const
{
    Q_ASSERT(mode > 0 && mode <= 4);
    // Short-cut Zulu suffix when it's all there is (rather than a prefix match):
    if (mode == 1 && str == u'Z')
        return ParsedSection(Acceptable, 0, 1);

    ParsedSection section;
    if (mode != 4)
        section = findUtcOffset(str, mode);
    if (mode != 2 && mode != 3 && section.used <= 0)  // if nothing used, try time zone parsing
        section = findTimeZoneName(str, when);
    // It can be a well formed time zone specifier, but with value out of range
    if (section.state == Acceptable && (section.value < minVal || section.value > maxVal))
        section.state = Intermediate;
    if (section.used > 0)
        return section;

    if (mode == 1) {
        // Check if string is UTC or alias to UTC, after all other options
        if (str.startsWith("UTC"_L1))
            return ParsedSection(Acceptable, 0, 3);
        if (str.startsWith(u'Z'))
            return ParsedSection(Acceptable, 0, 1);
    }

    return ParsedSection();
}